

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_compResetPolicy_e crp,ZSTD_indexResetPolicy_e forceResetIndex,
                 ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  void *__s;
  undefined1 auVar2 [16];
  ZSTD_strategy ZVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  uint *puVar9;
  ZSTD_match_t *pZVar10;
  ZSTD_optimal_t *pZVar11;
  size_t sVar12;
  uint uVar13;
  size_t local_40;
  
  if (cParams->strategy == ZSTD_fast) {
    local_40 = 0;
  }
  else {
    local_40 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  uVar13 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    uVar13 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar13 = cParams->windowLog;
    }
  }
  uVar1 = cParams->hashLog;
  if (forceResetIndex == ZSTDirp_reset) {
    (ms->window).base = "";
    (ms->window).dictBase = "";
    (ms->window).dictLimit = 1;
    (ms->window).lowLimit = 1;
    (ms->window).nextSrc = (BYTE *)"File %s";
    ZSTD_cwksp_mark_tables_dirty(ws);
  }
  ms->hashLog3 = uVar13;
  auVar2 = vpshufd_avx(ZEXT416((uint)(*(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base)),
                       0x10);
  *(undefined1 (*) [16])&(ms->window).dictLimit = auVar2;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  if (ws->allocFailed != 0) {
    __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2f8b,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ws->tableEnd = ws->objectEnd;
  ZSTD_cwksp_assert_internal_consistency(ws);
  pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,4L << ((byte)uVar1 & 0x3f));
  ms->hashTable = pUVar8;
  pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,local_40);
  ms->chainTable = pUVar8;
  sVar12 = 4L << ((byte)uVar13 & 0x3f);
  if (uVar13 == 0) {
    sVar12 = 0;
  }
  pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar12);
  ms->hashTable3 = pUVar8;
  if (ws->allocFailed == 0) {
    if (crp != ZSTDcrp_leaveDirty) {
      __s = ws->tableValidEnd;
      if (__s < ws->objectEnd) {
        __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1d6a,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
      }
      if (ws->allocStart < __s) {
        __assert_fail("ws->tableValidEnd <= ws->allocStart",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1d6b,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
      }
      if (__s < ws->tableEnd) {
        memset(__s,0,(long)ws->tableEnd - (long)__s);
      }
      ZSTD_cwksp_mark_tables_clean(ws);
    }
    if ((forWho == ZSTD_resetTarget_CCtx) && (6 < (int)cParams->strategy)) {
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
      (ms->opt).litFreq = puVar9;
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
      (ms->opt).litLengthFreq = puVar9;
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
      (ms->opt).matchLengthFreq = puVar9;
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
      (ms->opt).offCodeFreq = puVar9;
      pZVar10 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8008);
      (ms->opt).matchTable = pZVar10;
      pZVar11 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c01c);
      (ms->opt).priceTable = pZVar11;
    }
    uVar4 = cParams->windowLog;
    uVar5 = cParams->chainLog;
    uVar6 = cParams->hashLog;
    uVar7 = cParams->searchLog;
    uVar13 = cParams->minMatch;
    uVar1 = cParams->targetLength;
    ZVar3 = cParams->strategy;
    (ms->cParams).searchLog = cParams->searchLog;
    (ms->cParams).minMatch = uVar13;
    (ms->cParams).targetLength = uVar1;
    (ms->cParams).strategy = ZVar3;
    (ms->cParams).windowLog = uVar4;
    (ms->cParams).chainLog = uVar5;
    (ms->cParams).hashLog = uVar6;
    (ms->cParams).searchLog = uVar7;
    sVar12 = (ulong)(ws->allocFailed == 0) * 0x40 - 0x40;
  }
  else {
    sVar12 = 0xffffffffffffffc0;
  }
  return sVar12;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    size_t const chainSize = (cParams->strategy == ZSTD_fast) ? 0 : ((size_t)1 << cParams->chainLog);
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    return 0;
}